

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderBehaviorT<unsigned_long_long,long_long,double>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,unsigned_long_long *v,
               unsigned_long_long v_min,unsigned_long_long v_max,char *format,ImGuiSliderFlags flags
               ,ImRect *out_grab_bb)

{
  float fVar1;
  bool bVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  float *pfVar7;
  unsigned_long_long uVar8;
  unsigned_long_long *in_RCX;
  int in_EDX;
  ImGuiID in_ESI;
  ImVec2 *in_RDI;
  ulong in_R8;
  ulong in_R9;
  bool bVar9;
  bool bVar10;
  float axis_00;
  float fVar11;
  float fVar12;
  float lhs;
  float fVar13;
  float fVar14;
  float unaff_retaddr;
  undefined1 unaff_retaddr_00;
  unsigned_long_long in_stack_00000008;
  uint in_stack_00000010;
  undefined4 in_stack_00000014;
  float in_stack_00000018;
  ImGuiDataType in_stack_0000001c;
  float grab_pos_1;
  float grab_t_1;
  unsigned_long_long v_new_1;
  float new_clicked_t;
  unsigned_long_long v_new;
  float old_clicked_t;
  float delta;
  int decimal_precision_1;
  bool tweak_fast;
  bool tweak_slow;
  float input_delta;
  bool clicked_around_grab;
  float grab_pos;
  float grab_t;
  float mouse_abs_pos;
  float clicked_t;
  bool set_new_value;
  bool value_changed;
  int decimal_precision;
  float zero_deadzone_halfsize;
  float logarithmic_zero_epsilon;
  float slider_usable_pos_max;
  float slider_usable_pos_min;
  float slider_usable_sz;
  float grab_sz;
  float slider_sz;
  float grab_padding;
  longlong v_range;
  bool is_floating_point;
  bool is_logarithmic;
  ImGuiAxis axis;
  ImGuiStyle *style;
  ImGuiContext *g;
  int local_114;
  float in_stack_fffffffffffffef0;
  float in_stack_fffffffffffffef4;
  float in_stack_fffffffffffffef8;
  float fVar15;
  float in_stack_fffffffffffffefc;
  int in_stack_ffffffffffffff00;
  long local_f8;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  float local_c4;
  ImRect local_c0;
  unsigned_long_long local_b0;
  undefined4 in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  undefined8 in_stack_ffffffffffffff60;
  ImGuiDataType data_type_00;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  float local_88;
  float local_7c;
  bool local_6d;
  float local_54;
  float zero_deadzone_halfsize_00;
  
  pIVar3 = GImGui;
  data_type_00 = (ImGuiDataType)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  uVar6 = (uint)((in_stack_00000010 & 0x100000) != 0);
  bVar9 = in_EDX == 8;
  bVar10 = in_EDX == 9;
  if (in_R8 < in_R9) {
    local_f8 = in_R9 - in_R8;
  }
  else {
    local_f8 = in_R8 - in_R9;
  }
  axis_00 = ImVec2::operator[](in_RDI + 1,(long)(int)uVar6);
  zero_deadzone_halfsize_00 = (float)(in_R9 >> 0x20);
  fVar11 = ImVec2::operator[](in_RDI,(long)(int)uVar6);
  fVar11 = (axis_00 - fVar11) - 4.0;
  local_54 = (pIVar3->Style).GrabMinSize;
  if ((!bVar9 && !bVar10) && (-1 < local_f8)) {
    local_54 = ImMax<float>(fVar11 / (float)(local_f8 + 1),(pIVar3->Style).GrabMinSize);
  }
  fVar12 = ImMin<float>(local_54,fVar11);
  lhs = fVar11 - fVar12;
  fVar13 = ImVec2::operator[](in_RDI,(long)(int)uVar6);
  fVar13 = fVar12 * 0.5 + fVar13 + 2.0;
  fVar14 = ImVec2::operator[](in_RDI + 1,(long)(int)uVar6);
  fVar14 = -fVar12 * 0.5 + (fVar14 - 2.0);
  if ((in_stack_00000010 & 0x20) != 0) {
    if (bVar9 || bVar10) {
      in_stack_ffffffffffffff00 =
           ImParseFormatPrecision
                     ((char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                      (int)in_stack_fffffffffffffef4);
    }
    else {
      in_stack_ffffffffffffff00 = 1;
    }
    ImPow(0.0,7.59297e-39);
    in_stack_fffffffffffffefc = (pIVar3->Style).LogSliderDeadzone * 0.5;
    ImMax<float>(lhs,1.0);
  }
  local_6d = false;
  if (pIVar3->ActiveId == in_ESI) {
    bVar2 = false;
    if (pIVar3->ActiveIdSource == ImGuiInputSource_Mouse) {
      if (((pIVar3->IO).MouseDown[0] & 1U) == 0) {
        ClearActiveID();
      }
      else {
        pfVar7 = ImVec2::operator[](&(pIVar3->IO).MousePos,(long)(int)uVar6);
        fVar1 = *pfVar7;
        fVar15 = in_stack_fffffffffffffef8;
        if ((pIVar3->ActiveIdIsJustActivated & 1U) != 0) {
          local_7c = ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                               ((ImGuiDataType)unaff_retaddr,(unsigned_long_long)in_RDI,
                                CONCAT44(in_ESI,in_EDX),(unsigned_long_long)in_RCX,
                                SUB81(in_R8 >> 0x38,0),(float)in_R8,zero_deadzone_halfsize_00);
          if (uVar6 == 1) {
            local_7c = 1.0 - local_7c;
          }
          in_stack_fffffffffffffef4 = ImLerp<float>(fVar13,fVar14,local_7c);
          fVar15 = (float)((uint)in_stack_fffffffffffffef8 & 0xffffff);
          if ((-fVar12 * 0.5 + in_stack_fffffffffffffef4) - 1.0 <= fVar1) {
            fVar15 = (float)CONCAT13(fVar1 <= fVar12 * 0.5 + in_stack_fffffffffffffef4 + 1.0,
                                     SUB43(in_stack_fffffffffffffef8,0));
          }
          if (((char)((uint)fVar15 >> 0x18) == '\0') || (!bVar9 && !bVar10)) {
            in_stack_fffffffffffffef4 = 0.0;
          }
          else {
            in_stack_fffffffffffffef4 = fVar1 - in_stack_fffffffffffffef4;
          }
          pIVar3->SliderGrabClickOffset = in_stack_fffffffffffffef4;
        }
        if (0.0 < lhs) {
          ImSaturate(((fVar1 - pIVar3->SliderGrabClickOffset) - fVar13) / lhs);
        }
        bVar2 = true;
        in_stack_fffffffffffffef8 = fVar15;
      }
    }
    else if (pIVar3->ActiveIdSource == ImGuiInputSource_Nav) {
      if ((pIVar3->ActiveIdIsJustActivated & 1U) != 0) {
        pIVar3->SliderCurrentAccum = 0.0;
        pIVar3->SliderCurrentAccumDirty = false;
      }
      if (uVar6 == 0) {
        in_stack_fffffffffffffef0 = GetNavTweakPressedAmount((ImGuiAxis)axis_00);
      }
      else {
        in_stack_fffffffffffffef0 = GetNavTweakPressedAmount((ImGuiAxis)axis_00);
        in_stack_fffffffffffffef0 = -in_stack_fffffffffffffef0;
      }
      if ((in_stack_fffffffffffffef0 != 0.0) || (NAN(in_stack_fffffffffffffef0))) {
        fVar12 = in_stack_fffffffffffffef0;
        bVar4 = IsKeyDown(ImGuiKey_KeysData_OFFSET);
        bVar5 = IsKeyDown(ImGuiKey_KeysData_OFFSET);
        if (bVar9 || bVar10) {
          local_114 = ImParseFormatPrecision
                                ((char *)CONCAT44(in_stack_fffffffffffffefc,
                                                  in_stack_fffffffffffffef8),
                                 (int)in_stack_fffffffffffffef4);
        }
        else {
          local_114 = 0;
        }
        if (local_114 < 1) {
          if (((-100.0 <= (float)local_f8) && ((float)local_f8 <= 100.0)) || (bVar4)) {
            local_88 = (float)(~-(uint)(in_stack_fffffffffffffef0 < 0.0) & 0x3f800000 |
                              -(uint)(in_stack_fffffffffffffef0 < 0.0) & 0xbf800000) /
                       (float)local_f8;
          }
          else {
            local_88 = in_stack_fffffffffffffef0 / 100.0;
          }
        }
        else {
          local_88 = in_stack_fffffffffffffef0 / 100.0;
          if (bVar4) {
            local_88 = local_88 / 10.0;
          }
        }
        if (bVar5) {
          local_88 = local_88 * 10.0;
        }
        pIVar3->SliderCurrentAccum = local_88 + pIVar3->SliderCurrentAccum;
        pIVar3->SliderCurrentAccumDirty = true;
        in_stack_fffffffffffffef0 = fVar12;
      }
      in_stack_ffffffffffffff6c = pIVar3->SliderCurrentAccum;
      if ((pIVar3->NavActivatePressedId == in_ESI) && ((pIVar3->ActiveIdIsJustActivated & 1U) == 0))
      {
        ClearActiveID();
      }
      else if ((pIVar3->SliderCurrentAccumDirty & 1U) != 0) {
        fVar12 = ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                           ((ImGuiDataType)unaff_retaddr,(unsigned_long_long)in_RDI,
                            CONCAT44(in_ESI,in_EDX),(unsigned_long_long)in_RCX,
                            SUB81(in_R8 >> 0x38,0),(float)in_R8,zero_deadzone_halfsize_00);
        if (((1.0 <= fVar12) && (0.0 < in_stack_ffffffffffffff6c)) ||
           ((fVar12 <= 0.0 && (in_stack_ffffffffffffff6c < 0.0)))) {
          bVar2 = false;
          pIVar3->SliderCurrentAccum = 0.0;
        }
        else {
          bVar2 = true;
          ImSaturate(fVar12 + in_stack_ffffffffffffff6c);
          uVar8 = ScaleValueFromRatioT<unsigned_long_long,long_long,double>
                            (in_stack_0000001c,in_stack_00000018,
                             CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_00000008,
                             (bool)unaff_retaddr_00,unaff_retaddr,(float)((ulong)in_RDI >> 0x20));
          data_type_00 = (ImGuiDataType)(uVar8 >> 0x20);
          in_stack_ffffffffffffff68 = fVar12;
          if ((bVar9 || bVar10) && ((in_stack_00000010 & 0x40) == 0)) {
            uVar8 = RoundScalarWithFormatT<unsigned_long_long>
                              ((char *)CONCAT44(in_stack_ffffffffffffff6c,fVar12),data_type_00,
                               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
            data_type_00 = (ImGuiDataType)(uVar8 >> 0x20);
            in_stack_ffffffffffffff68 = fVar12;
          }
          in_stack_ffffffffffffff5c =
               ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                         ((ImGuiDataType)unaff_retaddr,(unsigned_long_long)in_RDI,
                          CONCAT44(in_ESI,in_EDX),(unsigned_long_long)in_RCX,SUB81(in_R8 >> 0x38,0),
                          (float)in_R8,zero_deadzone_halfsize_00);
          if (in_stack_ffffffffffffff6c <= 0.0) {
            fVar12 = ImMax<float>(in_stack_ffffffffffffff5c - in_stack_ffffffffffffff68,
                                  in_stack_ffffffffffffff6c);
            pIVar3->SliderCurrentAccum = pIVar3->SliderCurrentAccum - fVar12;
          }
          else {
            fVar12 = ImMin<float>(in_stack_ffffffffffffff5c - in_stack_ffffffffffffff68,
                                  in_stack_ffffffffffffff6c);
            pIVar3->SliderCurrentAccum = pIVar3->SliderCurrentAccum - fVar12;
          }
        }
        pIVar3->SliderCurrentAccumDirty = false;
      }
    }
    if (bVar2) {
      local_b0 = ScaleValueFromRatioT<unsigned_long_long,long_long,double>
                           (in_stack_0000001c,in_stack_00000018,
                            CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_00000008,
                            (bool)unaff_retaddr_00,unaff_retaddr,(float)((ulong)in_RDI >> 0x20));
      if ((bVar9 || bVar10) && ((in_stack_00000010 & 0x40) == 0)) {
        local_b0 = RoundScalarWithFormatT<unsigned_long_long>
                             ((char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                              data_type_00,
                              CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      }
      local_6d = *in_RCX != local_b0;
      if (local_6d) {
        *in_RCX = local_b0;
      }
    }
  }
  if (1.0 <= fVar11) {
    local_c4 = ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                         ((ImGuiDataType)unaff_retaddr,(unsigned_long_long)in_RDI,
                          CONCAT44(in_ESI,in_EDX),(unsigned_long_long)in_RCX,SUB81(in_R8 >> 0x38,0),
                          (float)in_R8,zero_deadzone_halfsize_00);
    if (uVar6 == 1) {
      local_c4 = 1.0 - local_c4;
    }
    ImLerp<float>(fVar13,fVar14,local_c4);
    if (uVar6 == 0) {
      ImRect::ImRect((ImRect *)CONCAT44(axis_00,in_stack_ffffffffffffff00),in_stack_fffffffffffffefc
                     ,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
      ;
      *(undefined8 *)CONCAT44(in_stack_0000001c,in_stack_00000018) = local_d8;
      ((undefined8 *)CONCAT44(in_stack_0000001c,in_stack_00000018))[1] = local_d0;
    }
    else {
      ImRect::ImRect((ImRect *)CONCAT44(axis_00,in_stack_ffffffffffffff00),in_stack_fffffffffffffefc
                     ,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
      ;
      *(undefined8 *)CONCAT44(in_stack_0000001c,in_stack_00000018) = local_e8;
      ((undefined8 *)CONCAT44(in_stack_0000001c,in_stack_00000018))[1] = local_e0;
    }
  }
  else {
    ImRect::ImRect(&local_c0,in_RDI,in_RDI);
    *(ImVec2 *)CONCAT44(in_stack_0000001c,in_stack_00000018) = local_c0.Min;
    ((ImVec2 *)CONCAT44(in_stack_0000001c,in_stack_00000018))[1] = local_c0.Max;
  }
  return local_6d;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);

    // Calculate bounds
    const float grab_padding = 2.0f; // FIXME: Should be part of style.
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    if (!is_floating_point && v_range >= 0)                                     // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize); // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                if (g.ActiveIdIsJustActivated)
                {
                    float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (axis == ImGuiAxis_Y)
                        grab_t = 1.0f - grab_t;
                    const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
                    const bool clicked_around_grab = (mouse_abs_pos >= grab_pos - grab_sz * 0.5f - 1.0f) && (mouse_abs_pos <= grab_pos + grab_sz * 0.5f + 1.0f); // No harm being extra generous here.
                    g.SliderGrabClickOffset = (clicked_around_grab && is_floating_point) ? mouse_abs_pos - grab_pos : 0.0f;
                }
                if (slider_usable_sz > 0.0f)
                    clicked_t = ImSaturate((mouse_abs_pos - g.SliderGrabClickOffset - slider_usable_pos_min) / slider_usable_sz);
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            float input_delta = (axis == ImGuiAxis_X) ? GetNavTweakPressedAmount(axis) : -GetNavTweakPressedAmount(axis);
            if (input_delta != 0.0f)
            {
                const bool tweak_slow = IsKeyDown((g.NavInputSource == ImGuiInputSource_Gamepad) ? ImGuiKey_NavGamepadTweakSlow : ImGuiKey_NavKeyboardTweakSlow);
                const bool tweak_fast = IsKeyDown((g.NavInputSource == ImGuiInputSource_Gamepad) ? ImGuiKey_NavGamepadTweakFast : ImGuiKey_NavKeyboardTweakFast);
                const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (tweak_slow)
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || tweak_slow)
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (tweak_fast)
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (is_floating_point && !(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (is_floating_point && !(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}